

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  N_Vector p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  N_Vector p_Var6;
  undefined8 uVar7;
  void *returnvalue;
  void *pvVar8;
  int jx;
  long lVar9;
  char *funcname;
  long lVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  int retval;
  N_Vector local_88;
  SUNContext sunctx;
  void *local_78;
  void *local_70;
  void *local_68;
  long local_60;
  SUNLogger logger;
  long local_50;
  sunrealtype t;
  undefined8 local_40;
  double local_38;
  
  bVar13 = true;
  iVar3 = 0;
  if ((1 < argc) && (iVar3 = atoi(argv[1]), argc != 2)) {
    iVar4 = atoi(argv[2]);
    bVar13 = iVar4 == 0;
  }
  retval = SUNContext_Create(0,&sunctx);
  iVar4 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar4 == 0) {
    retval = SUNLogger_Create(0,0,&logger);
    iVar4 = check_retval(&retval,"SUNLogger_Create",1);
    if (iVar4 == 0) {
      if (!bVar13) {
        retval = SUNLogger_SetInfoFilename(logger,"cvKrylovDemo_ls-info.txt");
        iVar4 = check_retval(&retval,"SUNLogger_SetInfoFilename",1);
        if (iVar4 != 0) {
          return 1;
        }
      }
      retval = SUNContext_SetLogger(sunctx,logger);
      iVar4 = check_retval(&retval,"SUNContext_SetLogger",1);
      if (iVar4 == 0) {
        p_Var6 = (N_Vector)N_VNew_Serial(200,sunctx);
        iVar4 = check_retval(p_Var6,"N_VNew_Serial",0);
        if (iVar4 == 0) {
          local_88 = p_Var6;
          local_68 = malloc(0x9a8);
          lVar11 = (long)local_68 + 0x640;
          local_50 = lVar11;
          for (lVar9 = 0; pvVar8 = local_68, lVar9 != 10; lVar9 = lVar9 + 1) {
            for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
              uVar7 = SUNDlsMat_newDenseMat(2,2);
              *(undefined8 *)(lVar11 + -0x640 + lVar10 * 8) = uVar7;
              uVar7 = SUNDlsMat_newDenseMat(2,2);
              *(undefined8 *)(lVar11 + -800 + lVar10 * 8) = uVar7;
              uVar7 = SUNDlsMat_newIndexArray(2);
              *(undefined8 *)(lVar11 + lVar10 * 8) = uVar7;
            }
            lVar11 = lVar11 + 0x50;
          }
          iVar4 = check_retval(local_68,"AllocUserData",2);
          if (iVar4 == 0) {
            *(N_Vector *)((long)pvVar8 + 0x998) = local_88;
            *(undefined8 *)((long)pvVar8 + 0x968) = 0x3f13104b57cf96af;
            *(undefined8 *)((long)pvVar8 + 0x970) = 0x4001c71c71c71c72;
            *(undefined8 *)((long)pvVar8 + 0x978) = 0x4001c71c71c71c72;
            *(undefined8 *)((long)pvVar8 + 0x980) = 0x3eab2dd8d6457178;
            *(undefined8 *)((long)pvVar8 + 0x988) = 0x3f2d7dbf487fcb92;
            *(undefined8 *)((long)pvVar8 + 0x990) = 0x3e216505a7da8610;
            SetInitialProfiles(local_88,2.2222222222222223,2.2222222222222223);
            returnvalue = (void *)CVodeCreate(2,sunctx);
            local_78 = returnvalue;
            iVar4 = check_retval(returnvalue,"CVodeCreate",0);
            if (iVar4 == 0) {
              retval = CVodeSetUserData(returnvalue,pvVar8);
              iVar4 = check_retval(&retval,"CVodeSetUserData",1);
              if (iVar4 == 0) {
                retval = CVodeInit(0,returnvalue,f,local_88);
                iVar4 = check_retval(&retval,"CVodeInit",1);
                if (iVar4 == 0) {
                  retval = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,returnvalue);
                  iVar4 = check_retval(&retval,"CVodeSStolerances",1);
                  if (iVar4 == 0) {
                    if (!bVar13) {
                      retval = CVodeSetMonitorFn(returnvalue,myMonitorFunction);
                      iVar4 = check_retval(&retval,"CVodeSetMonitorFn",1);
                      if (iVar4 != 0) {
                        return 1;
                      }
                      retval = CVodeSetMonitorFrequency(returnvalue,0x32);
                      iVar4 = check_retval(&retval,"CVodeSetMonitorFrequency",1);
                      if (iVar4 != 0) {
                        return 1;
                      }
                    }
                    local_40 = SUNNonlinSol_Newton(local_88,sunctx);
                    retval = CVodeSetNonlinearSolver(returnvalue,local_40);
                    iVar4 = check_retval(&retval,"CVodeSetNonlinearSolver",1);
                    if (iVar4 == 0) {
                      if (iVar3 == 2) {
                        uVar14 = 0xbff00000;
                      }
                      else {
                        uVar14 = 0;
                      }
                      local_60 = (ulong)uVar14 << 0x20;
                      if (iVar3 == 1) {
                        local_60 = 0x402c48c6001f0ac0;
                      }
                      local_70 = (void *)0x0;
                      iVar3 = 0;
                      p_Var6 = local_88;
                      do {
                        pvVar8 = local_68;
                        p_Var2 = local_88;
                        if (iVar3 == 0) {
                          SUNLinSolFree(local_70);
                          *(undefined4 *)((long)local_68 + 0x9a0) = 0;
                          printf(" -------");
                          puts(" \n| SPGMR |");
                          puts(" -------");
                          pvVar8 = (void *)SUNLinSol_SPGMR(p_Var6,1,0,sunctx);
                          iVar4 = check_retval(pvVar8,"SUNLinSol_SPGMR",0);
                          returnvalue = local_78;
                          if (iVar4 != 0) {
                            return 1;
                          }
                          retval = CVodeSetLinearSolver(local_78,pvVar8,0);
                          iVar4 = check_retval(&retval,"CVodeSetLinearSolver",1);
                        }
                        else {
                          if (iVar3 == 4) {
                            N_VDestroy(local_88);
                            for (lVar9 = 0; lVar11 = local_50, lVar9 != 10; lVar9 = lVar9 + 1) {
                              for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
                                SUNDlsMat_destroyMat(*(undefined8 *)(lVar11 + -0x640 + lVar10 * 8));
                                SUNDlsMat_destroyMat(*(undefined8 *)(lVar11 + -800 + lVar10 * 8));
                                SUNDlsMat_destroyArray(*(undefined8 *)(lVar11 + lVar10 * 8));
                              }
                              local_50 = lVar11 + 0x50;
                            }
                            free(local_68);
                            CVodeFree(&local_78);
                            SUNLinSolFree(local_70);
                            SUNNonlinSolFree(local_40);
                            SUNLogger_Destroy(&logger);
                            SUNContext_Free(&sunctx);
                            return 0;
                          }
                          *(N_Vector *)((long)local_68 + 0x998) = local_88;
                          *(undefined8 *)((long)local_68 + 0x968) = 0x3f13104b57cf96af;
                          *(undefined8 *)((long)local_68 + 0x970) = 0x4001c71c71c71c72;
                          *(undefined8 *)((long)local_68 + 0x978) = 0x4001c71c71c71c72;
                          *(undefined8 *)((long)local_68 + 0x980) = 0x3eab2dd8d6457178;
                          *(undefined8 *)((long)local_68 + 0x988) = 0x3f2d7dbf487fcb92;
                          *(undefined8 *)((long)local_68 + 0x990) = 0x3e216505a7da8610;
                          SetInitialProfiles(local_88,2.2222222222222223,2.2222222222222223);
                          retval = CVodeReInit(0,returnvalue,p_Var2);
                          iVar4 = check_retval(&retval,"CVodeReInit",1);
                          if (iVar4 != 0) {
                            return 1;
                          }
                          SUNLinSolFree(local_70);
                          *(int *)((long)pvVar8 + 0x9a0) = iVar3;
                          if (iVar3 == 1) {
                            printf(" ---------");
                            puts(" \n| SPFGMR |");
                            puts(" ---------");
                            pvVar8 = (void *)SUNLinSol_SPFGMR(local_88,1,0,sunctx);
                            funcname = "SUNLinSol_SPFGMR";
                          }
                          else if (iVar3 == 2) {
                            printf(" -------");
                            puts(" \n| SPBCGS |");
                            puts(" -------");
                            pvVar8 = (void *)SUNLinSol_SPBCGS(local_88,1,0,sunctx);
                            funcname = "SUNLinSol_SPBCGS";
                          }
                          else {
                            printf(" ---------");
                            puts(" \n| SPTFQMR |");
                            puts(" ---------");
                            pvVar8 = (void *)SUNLinSol_SPTFQMR(local_88,1,0,sunctx);
                            funcname = "SUNLinSol_SPTFQMR";
                          }
                          iVar4 = check_retval(pvVar8,funcname,0);
                          returnvalue = local_78;
                          if (iVar4 != 0) {
                            return 1;
                          }
                          retval = CVodeSetLinearSolver(local_78,pvVar8,0);
                          iVar4 = check_retval(&retval,"CVodeSetLinearSolver",1);
                        }
                        if (iVar4 != 0) {
                          return 1;
                        }
                        retval = CVodeSetPreconditioner(returnvalue,Precond,PSolve);
                        iVar4 = check_retval(&retval,"CVodeSetPreconditioner",1);
                        if (iVar4 != 0) {
                          return 1;
                        }
                        local_70 = pvVar8;
                        retval = CVodeSetLSNormFactor((int)local_60,returnvalue);
                        iVar4 = check_retval(&retval,"CVodeSetLSNormFactor",1);
                        if (iVar4 != 0) {
                          return 1;
                        }
                        puts(" \n2-species diurnal advection-diffusion problem\n");
                        iVar4 = 0xc;
                        dVar1 = 7200.0;
                        while (bVar12 = iVar4 != 0, iVar4 = iVar4 + -1, bVar12) {
                          local_38 = dVar1;
                          retval = CVode(returnvalue,local_88,&t,1);
                          if (bVar13) {
                            PrintOutput(returnvalue,local_88,t);
                          }
                          iVar5 = check_retval(&retval,"CVode",1);
                          if (iVar5 != 0) break;
                          dVar1 = local_38 + 7200.0;
                        }
                        p_Var6 = local_88;
                        if (!bVar13) {
                          PrintOutput(returnvalue,local_88,t);
                        }
                        PrintStats(returnvalue,iVar3,1);
                        iVar3 = iVar3 + 1;
                      } while( true );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  void* cvode_mem;
  int linsolver, iout, retval;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  int monitor;        /* LS resiudal monitoring flag    */
  SUNContext sunctx;
  SUNLogger logger;
  const char* info_fname = "cvKrylovDemo_ls-info.txt";

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  nrmfactor = 0;
  monitor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }
  if (argc > 2) { monitor = atoi(argv[2]); }

  /* Create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  retval = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_retval(&retval, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    retval = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_retval(&retval, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  retval = SUNContext_SetLogger(sunctx, logger);
  if (check_retval(&retval, "SUNContext_SetLogger", 1)) { return 1; }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data, u);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Set a function that CVode will call every 50 successful time steps.
   * This will be used to monitor the solution and integrator statistics. */
  if (monitor)
  {
    retval = CVodeSetMonitorFn(cvode_mem, myMonitorFunction);
    if (check_retval(&retval, "CVodeSetMonitorFn", 1)) { return (1); }
    retval = CVodeSetMonitorFrequency(cvode_mem, 50);
    if (check_retval(&retval, "CVodeSetMonitorFrequency", 1)) { return (1); }
  }

  /* Create the SUNNonlinearSolver */
  NLS = SUNNonlinSol_Newton(u, sunctx);
  if (check_retval(&retval, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Call CVodeSetNonlinearSolver to attach the nonlinear solver to CVode */
  retval = CVodeSetNonlinearSolver(cvode_mem, NLS);
  if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

  /* START: Loop through SPGMR, SPFGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize user data */
      InitUserData(data, u);
      SetInitialProfiles(u, data->dx, data->dy);

      /* Re-initialize CVode for the solution of the same problem, but
       using a different linear solver module */
      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    /* Set the linear solver type in user data */
    data->linsolver = linsolver;

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPFGMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPFGMR to specify the linear solver SPFGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPFGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Set preconditioner setup and solve routines Precond and PSolve,
       and the pointer to the user-defined block data */
    retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
    if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = CVodeSetLSNormFactor(cvode_mem, nrmfac);
    if (check_retval(&retval, "CVodeSetLSNormFactor", 1)) { return (1); }

    /* In loop over output points, call CVode, print results, and test for error */
    printf(" \n2-species diurnal advection-diffusion problem\n\n");
    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      if (!monitor) { PrintOutput(cvode_mem, u, t); }
      if (check_retval(&retval, "CVode", 1)) { break; }
    }
    if (monitor) { PrintOutput(cvode_mem, u, t); }
    PrintStats(cvode_mem, linsolver, 1);

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&sunctx);

  return (0);
}